

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rational.hpp
# Opt level: O0

void __thiscall
scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::Rational
          (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this,double x)

{
  BigInt<unsigned_int,_unsigned_long> local_b0;
  BigInt<unsigned_int,_unsigned_long> local_80;
  ulong local_60;
  uint64_t mantissa;
  uint64_t exponent;
  undefined8 uStack_48;
  bool negative;
  uint64_t mantissaDivisor;
  uint64_t mantissaFilter;
  undefined8 uStack_30;
  uint8_t exponentShift;
  uint64_t exponentFilter;
  uint64_t signFilter;
  uint64_t raw;
  double x_local;
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this_local;
  
  raw = (uint64_t)x;
  x_local = (double)this;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::Frac
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._vptr_Frac =
       (_func_int **)&PTR__Rational_00125bc0;
  signFilter = raw;
  exponentFilter = 0x8000000000000000;
  uStack_30 = 0x7ff0000000000000;
  mantissaFilter._7_1_ = 0x34;
  mantissaDivisor = 0xfffffffffffff;
  uStack_48 = 0x10000000000000;
  exponent._7_1_ = (byte)(raw >> 0x3f);
  mantissa = (uint64_t)((uint)(raw >> 0x34) & 0x7ff);
  local_60 = raw & 0xfffffffffffff;
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_80,0x10000000000000);
  BigInt<unsigned_int,_unsigned_long>::operator=
            (&(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q,&local_80);
  BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_80);
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_b0,local_60 + 0x10000000000000);
  BigInt<unsigned_int,_unsigned_long>::operator=
            (&(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p,&local_b0);
  BigInt<unsigned_int,_unsigned_long>::~BigInt(&local_b0);
  if (mantissa < 0x3ff) {
    BigInt<unsigned_int,_unsigned_long>::operator<<=
              (&(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q,0x3ff - mantissa);
  }
  else if (0x3ff < mantissa) {
    BigInt<unsigned_int,_unsigned_long>::operator<<=
              (&(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p,mantissa - 0x3ff);
  }
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::_simplify
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  return;
}

Assistant:

constexpr Rational<TInteger>::Rational(double x) : Frac<TInteger>()
	{
		const uint64_t raw = *reinterpret_cast<uint64_t*>(&x);

		constexpr uint64_t signFilter = 0x8000000000000000;
		constexpr uint64_t exponentFilter = 0x7FF0000000000000;
		constexpr uint8_t exponentShift = 52;
		constexpr uint64_t mantissaFilter = 0x000FFFFFFFFFFFFF;
		constexpr uint64_t mantissaDivisor = 0x0010000000000000;

		bool negative = (raw & signFilter) != 0;
		uint64_t exponent = (raw & exponentFilter) >> exponentShift;
		uint64_t mantissa = (raw & mantissaFilter);

		_q = mantissaDivisor;
		_p = mantissaDivisor + mantissa;

		if (exponent < 1023)
		{
			_q <<= 1023 - exponent;
		}
		else if (exponent > 1023)
		{
			_p <<= exponent - 1023;
		}

		_simplify();
	}